

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

cmGeneratorTarget * __thiscall
cmGeneratorTarget::FindTargetToLink(cmGeneratorTarget *this,string *name)

{
  bool bVar1;
  cmGeneratorTarget *this_00;
  ostream *poVar2;
  cmake *this_01;
  ostringstream e;
  string local_1f0;
  cmListFileBacktrace local_1d0;
  undefined1 local_190 [376];
  
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse(this->LocalGenerator,name);
  if (this_00 == (cmGeneratorTarget *)0x0) {
    this_00 = (cmGeneratorTarget *)0x0;
  }
  else if (this_00->Target->TargetTypeValue == EXECUTABLE) {
    bVar1 = IsExecutableWithExports(this_00);
    if (!bVar1) {
      this_00 = (cmGeneratorTarget *)0x0;
    }
  }
  if (this_00 != (cmGeneratorTarget *)0x0) {
    if (this_00->Target->TargetTypeValue != OBJECT_LIBRARY) {
      return this_00;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Target \"",8);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,(this->Target->Name)._M_dataplus._M_p,
                        (this->Target->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" links to OBJECT library \"",0x1b);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(this_00->Target->Name)._M_dataplus._M_p,
                        (this_00->Target->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "\" but this is not allowed.  One may link only to STATIC or SHARED libraries, or to executables with the ENABLE_EXPORTS property set."
               ,0x84);
    this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    std::__cxx11::stringbuf::str();
    GetBacktrace(&local_1d0,this);
    cmake::IssueMessage(this_01,FATAL_ERROR,&local_1f0,&local_1d0,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
    std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  }
  return (cmGeneratorTarget *)0x0;
}

Assistant:

cmGeneratorTarget*
cmGeneratorTarget::FindTargetToLink(std::string const& name) const
{
  cmGeneratorTarget* tgt =
      this->LocalGenerator->FindGeneratorTargetToUse(name);

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if(tgt && tgt->GetType() == cmState::EXECUTABLE &&
     !tgt->IsExecutableWithExports())
    {
    tgt = 0;
    }

  if(tgt && tgt->GetType() == cmState::OBJECT_LIBRARY)
    {
    std::ostringstream e;
    e << "Target \"" << this->GetName() << "\" links to "
      "OBJECT library \"" << tgt->GetName() << "\" but this is not "
      "allowed.  "
      "One may link only to STATIC or SHARED libraries, or to executables "
      "with the ENABLE_EXPORTS property set.";
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(cmake::FATAL_ERROR, e.str(),
                     this->GetBacktrace());
    tgt = 0;
    }

  return tgt;
}